

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedChargeAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::FixedChargeAdapter::makeFixedCharge(FixedChargeAdapter *this,RealType charge)

{
  bool bVar1;
  undefined8 *in_RDI;
  shared_ptr<OpenMD::GenericData> *in_stack_00000018;
  AtomType *in_stack_00000020;
  FixedChargeAtypeParameters fcParam;
  string *in_stack_ffffffffffffff98;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_> *__r;
  AtomType *in_stack_ffffffffffffffa0;
  shared_ptr<OpenMD::GenericData> *this_00;
  FixedChargeAtypeParameters *in_stack_ffffffffffffffc0;
  element_type *in_stack_ffffffffffffffc8;
  
  bVar1 = isFixedCharge((FixedChargeAdapter *)0x29c23e);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  this_00 = (shared_ptr<OpenMD::GenericData> *)*in_RDI;
  __r = (shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_> *)
        &stack0xffffffffffffffc8;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>,std::__cxx11::string_const&,OpenMD::FixedChargeAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>,void>(this_00,__r);
  AtomType::addProperty(in_stack_00000020,in_stack_00000018);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x29c2c2);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_> *)0x29c2cc);
  return;
}

Assistant:

void FixedChargeAdapter::makeFixedCharge(RealType charge) {
    if (isFixedCharge()) { at_->removeProperty(FCtypeID); }

    FixedChargeAtypeParameters fcParam {};
    fcParam.charge = charge;

    at_->addProperty(std::make_shared<FixedChargeAtypeData>(FCtypeID, fcParam));
  }